

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>,_bool>
 __thiscall
itlib::
flat_set<Rml::PropertyId,_itlib::fsimpl::less,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
::insert<Rml::PropertyId>
          (flat_set<Rml::PropertyId,_itlib::fsimpl::less,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
           *this,PropertyId *val)

{
  __normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<__gnu_cxx::__normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>,_bool>
  pVar2;
  
  __position._M_current = (PropertyId *)lower_bound<Rml::PropertyId>(this,val);
  if ((__position._M_current ==
       (this->m_container).super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
       _M_impl.super__Vector_impl_data._M_finish) || (*val < *__position._M_current)) {
    __position._M_current =
         (PropertyId *)
         std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::_M_insert_rval
                   (&this->m_container,(const_iterator)__position._M_current,val);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first._M_current = __position._M_current;
  return pVar2;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val);
        if (i != end() && !cmp()(val, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }